

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Segment::ParseNext
          (Segment *this,Cluster *pCurr,Cluster **pResult,longlong *pos,long *len)

{
  int iVar1;
  long lVar2;
  Cluster *pCVar3;
  ulong uVar4;
  longlong lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  longlong avail;
  longlong total;
  long local_40;
  long local_38;
  
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8c,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  if (pCurr->m_pSegment == (Segment *)0x0) {
    __assert_fail("!pCurr->EOS()",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8d,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  if (this->m_clusters == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8e,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  *pResult = (Cluster *)0x0;
  lVar2 = pCurr->m_index;
  if (-1 < lVar2) {
    if (this->m_clusters[lVar2] != pCurr) {
      __assert_fail("m_clusters[pCurr->m_index] == pCurr",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa93,
                    "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                   );
    }
    if (lVar2 + 1 < this->m_clusterCount) {
      pCVar3 = this->m_clusters[lVar2 + 1];
    }
    else {
      do {
        lVar2 = DoLoadCluster(this,pos,len);
      } while (1 < lVar2);
      if (lVar2 < 0) {
        return lVar2;
      }
      if (lVar2 != 0) {
        return 1;
      }
      pCVar3 = GetLast(this);
    }
    *pResult = pCVar3;
    return 0;
  }
  if (this->m_pos < 1) {
    __assert_fail("m_pos > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xaad,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_38,&local_40);
  if (iVar1 < 0) {
    return (long)iVar1;
  }
  if (local_38 < local_40 && -1 < local_38) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xab6,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  lVar2 = -1;
  if (-1 < this->m_size) {
    lVar2 = this->m_start + this->m_size;
  }
  lVar8 = pCurr->m_element_start;
  *pos = lVar8;
  if (-1 < pCurr->m_element_size) {
    *pos = pCurr->m_element_size + lVar8;
    goto LAB_001145df;
  }
  if (local_40 <= lVar8) {
    *len = 1;
    return -3;
  }
  uVar4 = GetUIntLength(this->m_pReader,lVar8,len);
  bVar9 = uVar4 != 0;
  if (((long)uVar4 < 0) || (uVar4 = 0xfffffffffffffffd, bVar9)) {
LAB_00114681:
    bVar9 = false;
    uVar6 = uVar4;
  }
  else {
    if ((-1 < lVar2) && (lVar2 < *len + *pos)) {
LAB_00114665:
      uVar4 = 0xfffffffffffffffe;
      goto LAB_00114681;
    }
    if (local_40 < *len + *pos) goto LAB_00114681;
    lVar5 = ReadUInt(this->m_pReader,*pos,len);
    if (lVar5 != 0x1f43b675) {
      uVar4 = 0xffffffffffffffff;
      goto LAB_00114681;
    }
    lVar8 = *pos + *len;
    *pos = lVar8;
    if (local_40 <= lVar8) {
      *len = 1;
      goto LAB_00114681;
    }
    uVar6 = GetUIntLength(this->m_pReader,lVar8,len);
    if (-1 < (long)uVar6) {
      if (uVar6 == 0) {
        if ((-1 < lVar2) && (lVar2 < *len + *pos)) goto LAB_00114665;
        if (*len + *pos <= local_40) {
          uVar6 = ReadUInt(this->m_pReader,*pos,len);
          if ((long)uVar6 < 0) goto LAB_00114794;
          lVar8 = *len;
          lVar7 = *pos + lVar8;
          *pos = lVar7;
          uVar4 = 0xfffffffffffffffe;
          if (((-1L << ((char)lVar8 * '\a' & 0x3fU) ^ uVar6) != 0xffffffffffffffff) &&
             ((lVar7 = lVar7 + uVar6, lVar2 < 0 || (lVar7 <= lVar2)))) {
            *pos = lVar7;
            bVar9 = true;
            uVar6 = uVar4;
            goto LAB_00114683;
          }
        }
      }
      goto LAB_00114681;
    }
LAB_00114794:
    bVar9 = false;
  }
LAB_00114683:
  if (!bVar9) {
    return uVar6;
  }
LAB_001145df:
  do {
    lVar2 = DoParseNext(this,pResult,pos,len);
  } while (1 < lVar2);
  return lVar2;
}

Assistant:

long Segment::ParseNext(const Cluster* pCurr, const Cluster*& pResult,
                        long long& pos, long& len) {
  assert(pCurr);
  assert(!pCurr->EOS());
  assert(m_clusters);

  pResult = 0;

  if (pCurr->m_index >= 0) {  // loaded (not merely preloaded)
    assert(m_clusters[pCurr->m_index] == pCurr);

    const long next_idx = pCurr->m_index + 1;

    if (next_idx < m_clusterCount) {
      pResult = m_clusters[next_idx];
      return 0;  // success
    }

    // curr cluster is last among loaded

    const long result = LoadCluster(pos, len);

    if (result < 0)  // error or underflow
      return result;

    if (result > 0)  // no more clusters
    {
      // pResult = &m_eos;
      return 1;
    }

    pResult = GetLast();
    return 0;  // success
  }

  assert(m_pos > 0);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // interrogate curr cluster

  pos = pCurr->m_element_start;

  if (pCurr->m_element_size >= 0)
    pos += pCurr->m_element_size;
  else {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadUInt(m_pReader, pos, len);

    if (id != libwebm::kMkvCluster)
      return -1;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)  // TODO: should never happen
      return E_FILE_FORMAT_INVALID;  // TODO: resolve this

    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // Pos now points to start of payload

    pos += size;  // consume payload (that is, the current cluster)
    if (segment_stop >= 0 && pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    // By consuming the payload, we are assuming that the curr
    // cluster isn't interesting.  That is, we don't bother checking
    // whether the payload of the curr cluster is less than what
    // happens to be available (obtained via IMkvReader::Length).
    // Presumably the caller has already dispensed with the current
    // cluster, and really does want the next cluster.
  }

  // pos now points to just beyond the last fully-loaded cluster

  for (;;) {
    const long status = DoParseNext(pResult, pos, len);

    if (status <= 1)
      return status;
  }
}